

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::load_model(ConvolutionDepthWise_x86 *this,ModelBin *mb)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  Allocator *pAVar4;
  void *pvVar5;
  int *piVar6;
  long lVar7;
  long *plVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  int iVar12;
  undefined4 uVar13;
  pointer ppLVar14;
  Layer *pLVar15;
  pointer ppLVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  void *pvVar20;
  int iVar21;
  long lVar22;
  bool bVar23;
  ParamDict pd;
  int local_6fc;
  uint local_6f8;
  long local_6f0;
  Allocator *local_6e8;
  size_t local_6e0;
  undefined1 local_6c8 [24];
  long *plStack_6b0;
  Mat local_638;
  void *local_600;
  undefined8 local_5f8;
  size_t local_5f0;
  Allocator *local_5e8;
  uint local_5e0;
  int local_5dc;
  uint local_5d8;
  uint local_5d4;
  long local_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  ModelBinFromMatArray local_550;
  ParamDict local_540;
  
  iVar12 = ConvolutionDepthWise::load_model(&this->super_ConvolutionDepthWise,mb);
  if (iVar12 == 0) {
    iVar12 = (this->super_ConvolutionDepthWise).num_output;
    iVar17 = (this->super_ConvolutionDepthWise).kernel_h *
             (this->super_ConvolutionDepthWise).kernel_w;
    iVar21 = (this->super_ConvolutionDepthWise).group;
    uVar9 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)iVar21;
    uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)iVar17;
    ppLVar16 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ppLVar14 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)ppLVar16 - (long)ppLVar14) >> 3)) {
      lVar19 = 0;
      do {
        if (ppLVar14[lVar19] != (Layer *)0x0) {
          (*ppLVar14[lVar19]->_vptr_Layer[1])();
          ppLVar14 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppLVar16 = (this->group_ops).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (int)((ulong)((long)ppLVar16 - (long)ppLVar14) >> 3));
    }
    iVar21 = (int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                  (long)(iVar12 / iVar21)) * iVar21;
    if (ppLVar16 != ppLVar14) {
      (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppLVar14;
    }
    iVar12 = (this->super_ConvolutionDepthWise).group;
    iVar18 = (this->super_ConvolutionDepthWise).num_output;
    if (((iVar21 == iVar12) &&
        (auVar10._4_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_w == 3),
        auVar10._0_4_ = -(uint)(iVar12 == iVar18),
        auVar10._8_4_ = -(uint)((this->super_ConvolutionDepthWise).kernel_h == 3),
        auVar10._12_4_ = -(uint)((this->super_ConvolutionDepthWise).dilation_w == 1),
        uVar13 = movmskps((int)ppLVar14,auVar10), (char)uVar13 == '\x0f')) &&
       ((this->super_ConvolutionDepthWise).dilation_h == 1)) {
      iVar1 = (this->super_ConvolutionDepthWise).stride_w;
      iVar2 = (this->super_ConvolutionDepthWise).stride_h;
      if (iVar2 == 1 && iVar1 == 1) {
        return 0;
      }
      if (iVar2 == 2 && iVar1 == 2) {
        return 0;
      }
    }
    iVar18 = iVar18 / iVar12;
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (&this->group_ops,(long)iVar12);
    if (0 < (this->super_ConvolutionDepthWise).group) {
      iVar12 = (iVar21 / iVar12) * iVar17 * iVar18;
      lVar19 = 0;
      do {
        sVar3 = (this->super_ConvolutionDepthWise).weight_data.elemsize;
        pAVar4 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        pvVar5 = (this->super_ConvolutionDepthWise).weight_data.data;
        plStack_6b0 = (long *)0x0;
        local_6c8._0_16_ = (undefined1  [16])0x0;
        bVar23 = (this->super_ConvolutionDepthWise).bias_term == 0;
        if (bVar23) {
          local_6f0 = 0;
          local_6fc = 0;
          local_6e8 = (Allocator *)0x0;
          local_6e0 = 0;
          pvVar20 = (void *)0x0;
        }
        else {
          local_6e0 = (this->super_ConvolutionDepthWise).bias_data.elemsize;
          pvVar20 = (void *)(lVar19 * iVar18 * local_6e0 +
                            (long)(this->super_ConvolutionDepthWise).bias_data.data);
          local_6e8 = (this->super_ConvolutionDepthWise).bias_data.allocator;
          uVar11 = (this->super_ConvolutionDepthWise).bias_data.allocator;
          local_6c8._8_8_ = 0;
          local_6c8._0_8_ = pvVar20;
          local_6fc = iVar18;
          local_6f0 = (long)iVar18;
          plStack_6b0 = (long *)uVar11;
        }
        local_6f8 = (uint)!bVar23;
        pLVar15 = create_layer(6);
        ParamDict::ParamDict(&local_540);
        ParamDict::set(&local_540,0,iVar18);
        ParamDict::set(&local_540,1,(this->super_ConvolutionDepthWise).kernel_w);
        ParamDict::set(&local_540,0xb,(this->super_ConvolutionDepthWise).kernel_h);
        ParamDict::set(&local_540,2,(this->super_ConvolutionDepthWise).dilation_w);
        ParamDict::set(&local_540,0xc,(this->super_ConvolutionDepthWise).dilation_h);
        ParamDict::set(&local_540,3,(this->super_ConvolutionDepthWise).stride_w);
        ParamDict::set(&local_540,0xd,(this->super_ConvolutionDepthWise).stride_h);
        ParamDict::set(&local_540,4,0);
        ParamDict::set(&local_540,0xe,0);
        ParamDict::set(&local_540,5,(this->super_ConvolutionDepthWise).bias_term);
        ParamDict::set(&local_540,6,iVar12);
        ParamDict::set(&local_540,8,(this->super_ConvolutionDepthWise).int8_scale_term);
        (*pLVar15->_vptr_Layer[2])(pLVar15,&local_540);
        local_568 = (undefined1  [16])0x0;
        local_578 = (undefined1  [16])0x0;
        local_588 = (undefined1  [16])0x0;
        local_598 = (undefined1  [16])0x0;
        local_5a8 = (undefined1  [16])0x0;
        local_5b8 = (undefined1  [16])0x0;
        local_5c8 = (undefined1  [16])0x0;
        local_638.refcount = (int *)0x0;
        local_638.dims = 1;
        local_638.h = 1;
        local_638.c = 1;
        local_5f8 = 0;
        local_5f0 = local_6e0;
        local_5e8 = local_6e8;
        local_5e0 = local_6f8;
        local_5dc = local_6fc;
        local_5d8 = local_6f8;
        local_5d4 = local_6f8;
        local_5d0 = local_6f0;
        if ((this->super_ConvolutionDepthWise).int8_scale_term != 0) {
          local_5b8._0_8_ = (this->super_ConvolutionDepthWise).weight_data_int8_scales.elemsize;
          local_5b8._8_8_ = (this->super_ConvolutionDepthWise).weight_data_int8_scales.allocator;
          local_5c8._8_8_ = 0;
          local_5c8._0_8_ =
               (void *)((this->super_ConvolutionDepthWise).weight_data_int8_scales.elemsize * lVar19
                       + (long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.data);
          local_5a8._8_8_ = 0x100000001;
          local_5a8._0_8_ = 0x100000001;
          uVar9 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.elemsize;
          local_598._8_8_ =
               (void *)(uVar9 * lVar19 +
                       (long)(this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data);
          local_598._0_8_ = 1;
          local_588._8_8_ = 0;
          local_588._0_8_ = uVar9;
          local_588 = local_588 << 0x40;
          local_578._8_8_ = 0x100000001;
          local_578._0_8_ = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.allocator;
          local_568._8_8_ = 1;
          local_568._0_8_ = 0x100000001;
        }
        local_638.data = (void *)(lVar19 * iVar12 * sVar3 + (long)pvVar5);
        local_638.elemsize = sVar3;
        local_638.allocator = pAVar4;
        local_638.w = iVar12;
        local_638.cstep = (long)iVar12;
        local_600 = pvVar20;
        ModelBinFromMatArray::ModelBinFromMatArray(&local_550,&local_638);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_550);
        (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = pLVar15;
        lVar22 = 0xa8;
        do {
          piVar6 = *(int **)((long)&local_638.refcount + lVar22);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              lVar7 = *(long *)((long)&local_638.data + lVar22);
              plVar8 = *(long **)((long)&local_638.allocator + lVar22);
              if (plVar8 == (long *)0x0) {
                if (lVar7 != 0) {
                  free(*(void **)(lVar7 + -8));
                }
              }
              else {
                (**(code **)(*plVar8 + 8))();
              }
            }
          }
          *(undefined1 (*) [16])((long)&local_638.data + lVar22) = (undefined1  [16])0x0;
          *(undefined8 *)((long)&local_638.elemsize + lVar22) = 0;
          *(undefined8 *)((long)&local_638.cstep + lVar22) = 0;
          *(undefined1 (*) [16])((long)&local_638.dims + lVar22) = (undefined1  [16])0x0;
          lVar22 = lVar22 + -0x38;
        } while (lVar22 != -0x38);
        lVar22 = 0x4d8;
        do {
          piVar6 = *(int **)((long)local_540.params + lVar22 + -8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              lVar7 = *(long *)((long)local_540.params + lVar22 + -0x10);
              plVar8 = *(long **)((long)&local_540.params[0].v.data + lVar22);
              if (plVar8 == (long *)0x0) {
                if (lVar7 != 0) {
                  free(*(void **)(lVar7 + -8));
                }
              }
              else {
                (**(code **)(*plVar8 + 8))();
              }
            }
          }
          *(undefined1 (*) [16])((long)local_540.params + lVar22 + -0x10) = (undefined1  [16])0x0;
          *(undefined8 *)((long)&local_540.params[0].loaded + lVar22) = 0;
          *(undefined8 *)((long)&local_540.params[0].v.allocator + lVar22) = 0;
          *(undefined1 (*) [16])((long)&local_540.params[0].v.refcount + lVar22) =
               (undefined1  [16])0x0;
          lVar22 = lVar22 + -0x40;
        } while (lVar22 != -0x28);
        if ((int *)local_6c8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_6c8._8_8_ = *(int *)local_6c8._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_6c8._8_8_ == 0) {
            if (plStack_6b0 == (long *)0x0) {
              if (local_6c8._0_8_ != 0) {
                free(*(void **)(local_6c8._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*plStack_6b0 + 8))();
            }
          }
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (this->super_ConvolutionDepthWise).group);
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int ConvolutionDepthWise_x86::load_model(const ModelBin& mb)
{
    int ret = ConvolutionDepthWise::load_model(mb);
    if (ret != 0)
        return ret;

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g=0; g<group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        ncnn::Mat weights[4];
        weights[0] = weight_data_g;
        weights[1] = bias_data_g;

        if (int8_scale_term)
        {
            weights[2] = weight_data_int8_scales.range(g, 1);
            weights[3] = bottom_blob_int8_scales.range(g, 1);
        }

        op->load_model(ModelBinFromMatArray(weights));

        group_ops[g] = op;
    }

    return 0;
}